

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureRandomDataProvider.cc
# Opt level: O3

void __thiscall
SecureRandomDataProvider::provideRandomData(SecureRandomDataProvider *this,uchar *data,size_t len)

{
  int iVar1;
  size_t sVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  anon_class_1_0_00000001 *this_01;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (provideRandomData(unsigned_char*,unsigned_long)::random_device == '\0') {
    this_01 = (anon_class_1_0_00000001 *)
              &provideRandomData(unsigned_char*,unsigned_long)::random_device;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      provideRandomData::anon_class_1_0_00000001::operator()(this_01);
      __cxa_atexit(std::unique_ptr<QUtil::FileCloser,_std::default_delete<QUtil::FileCloser>_>::
                   ~unique_ptr,&provideRandomData::random_device,&__dso_handle);
      __cxa_guard_release(&provideRandomData(unsigned_char*,unsigned_long)::random_device);
    }
  }
  sVar2 = fread(data,1,len,
                *(FILE **)provideRandomData::random_device._M_t.
                          super___uniq_ptr_impl<QUtil::FileCloser,_std::default_delete<QUtil::FileCloser>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QUtil::FileCloser_*,_std::default_delete<QUtil::FileCloser>_>
                          .super__Head_base<0UL,_QUtil::FileCloser_*,_false>._M_head_impl);
  if (sVar2 == len) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_80,len);
  std::operator+(&local_40,"unable to read ",&local_80);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_60 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
SecureRandomDataProvider::provideRandomData(unsigned char* data, size_t len)
{
# if defined(_WIN32)

    // Optimization: make the WindowsCryptProvider static as long as
    // it can be done in a thread-safe fashion.
    WindowsCryptProvider c;
    if (!CryptGenRandom(c.crypt_prov, static_cast<DWORD>(len), reinterpret_cast<BYTE*>(data))) {
        throw std::runtime_error("unable to generate secure random data");
    }

# else
    static std::unique_ptr<QUtil::FileCloser> random_device = []() {
        FILE* f = fopen("/dev/urandom", "rb");
        if (f == nullptr) {
            f = fopen("/dev/arandom", "rb");
        }
        if (f == nullptr) {
            f = fopen("/dev/random", "rb");
        }
        if (f == nullptr) {
            throw std::runtime_error("unable to find device in /dev for generating random numbers");
        }
        return std::make_unique<QUtil::FileCloser>(f);
    }();

    size_t fr = fread(data, 1, len, random_device->f);
    if (fr != len) {
        throw std::runtime_error(
            "unable to read " + std::to_string(len) + " bytes from random number device");
    }

# endif
}